

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode SecureChannelHandshake(UA_Client *client,UA_Boolean renew)

{
  UA_Connection *connection;
  UA_Byte **offset_00;
  UA_ByteString *p;
  UA_Boolean UVar1;
  UA_StatusCode UVar2;
  UA_StatusCode UVar3;
  UA_StatusCode UVar4;
  UA_StatusCode UVar5;
  UA_StatusCode UVar6;
  long lVar7;
  long lVar8;
  undefined8 uVar9;
  char *msg;
  int iVar10;
  undefined7 in_register_00000031;
  UA_Byte *pUVar11;
  undefined8 uStack_258;
  UA_OpenSecureChannelRequest opnSecRq;
  UA_OpenSecureChannelResponse response;
  timespec ts_1;
  undefined1 local_c0 [8];
  UA_NodeId expectedRequest;
  UA_NodeId requestType;
  UA_UInt32 local_84;
  UA_UInt32 local_80;
  UA_SequenceHeader seqHeader;
  UA_ByteString local_68;
  int local_54;
  undefined1 local_50 [8];
  UA_ByteString message;
  size_t offset;
  UA_Boolean realloced;
  
  iVar10 = (int)CONCAT71(in_register_00000031,renew);
  if ((iVar10 != 0) &&
     (lVar8 = client->nextChannelRenewal, clock_gettime(4,(timespec *)&opnSecRq.requestedLifetime),
     CONCAT44(response.responseHeader.timestamp._4_4_,(undefined4)response.responseHeader.timestamp)
     / 100 + opnSecRq._144_8_ * 10000000 < lVar8)) {
    return 0;
  }
  UVar2 = 0x800d0000;
  if ((client->connection).state == UA_CONNECTION_ESTABLISHED) {
    connection = &client->connection;
    UVar2 = (*(client->connection).getSendBuffer)
                      (connection,(ulong)(client->connection).remoteConf.recvBufferSize,
                       (UA_ByteString *)local_50);
    if (UVar2 == 0) {
      message.data = (UA_Byte *)0xc;
      ts_1.tv_nsec = 0x2f;
      pos = (UA_Byte *)(message.length + 0xc);
      end = (UA_Byte *)(message.length + (long)local_50);
      exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
      exchangeBufferCallbackHandle = (void *)0x0;
      encodeBuf = (UA_ByteString *)local_50;
      UVar3 = UA_encodeBinaryInternal(&ts_1.tv_nsec,UA_TRANSPORT + 5);
      message.data = pos + -message.length;
      local_84 = (client->channel).sendSequenceNumber + 1;
      (client->channel).sendSequenceNumber = local_84;
      local_80 = client->requestId + 1;
      client->requestId = local_80;
      end = (UA_Byte *)(message.length + (long)local_50);
      exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
      exchangeBufferCallbackHandle = (void *)0x0;
      encodeBuf = (UA_ByteString *)local_50;
      UVar4 = UA_encodeBinaryInternal(&local_84,UA_TRANSPORT + 7);
      message.data = pos + -message.length;
      expectedRequest.identifier._8_2_ = 0;
      expectedRequest.identifier._12_4_ = 0;
      end = (UA_Byte *)(message.length + (long)local_50);
      exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
      exchangeBufferCallbackHandle = (void *)0x0;
      encodeBuf = (UA_ByteString *)local_50;
      UVar5 = UA_encodeBinaryInternal
                        ((void *)((long)&expectedRequest.identifier + 8),UA_TYPES + 0x10);
      pUVar11 = pos + -message.length;
      message.data = pUVar11;
      memset(&uStack_258,0,0x98);
      gettimeofday((timeval *)&opnSecRq.requestedLifetime,(__timezone_ptr_t)0x0);
      opnSecRq.requestHeader.authenticationToken.identifier.string.data =
           (UA_Byte *)
           (opnSecRq._144_8_ * 10000000 +
            CONCAT44(response.responseHeader.timestamp._4_4_,
                     (undefined4)response.responseHeader.timestamp) * 10 + 0x19db1ded53e8000);
      uStack_258._0_2_ = (client->authenticationToken).namespaceIndex;
      uStack_258._2_2_ = *(undefined2 *)&(client->authenticationToken).field_0x2;
      uStack_258._4_4_ = (client->authenticationToken).identifierType;
      opnSecRq.requestHeader.authenticationToken._0_8_ =
           (client->authenticationToken).identifier.string.length;
      opnSecRq.requestHeader.authenticationToken.identifier.string.length =
           (size_t)(client->authenticationToken).identifier.string.data;
      opnSecRq.requestHeader.additionalHeader.content._36_4_ = ZEXT14(renew);
      opnSecRq.clientProtocolVersion = 1;
      opnSecRq._120_8_ = (client->channel).clientNonce.length;
      opnSecRq.clientNonce.length = (size_t)(client->channel).clientNonce.data;
      opnSecRq.clientNonce.data._0_4_ = (client->config).secureChannelLifeTime;
      pos = pUVar11 + message.length;
      end = (UA_Byte *)(message.length + (long)local_50);
      exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
      exchangeBufferCallbackHandle = (void *)0x0;
      encodeBuf = (UA_ByteString *)local_50;
      local_54 = iVar10;
      UVar6 = UA_encodeBinaryInternal(&uStack_258,UA_TYPES + 0x61);
      seqHeader.requestId = (int)pos - (int)message.length;
      seqHeader.sequenceNumber = 0x464e504f;
      message.data = (UA_Byte *)0x0;
      pos = (UA_Byte *)message.length;
      end = (UA_Byte *)(message.length + (long)local_50);
      exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
      exchangeBufferCallbackHandle = (void *)0x0;
      encodeBuf = (UA_ByteString *)local_50;
      UVar2 = UA_encodeBinaryInternal(&seqHeader,UA_TRANSPORT + 0xb);
      message.data = pos + -message.length;
      UVar2 = UVar6 | UVar5 | UVar4 | UVar3 | UVar2;
      if (UVar2 == 0) {
        local_50 = (undefined1  [8])(ulong)seqHeader.requestId;
        UVar2 = (*(client->connection).send)(connection,(UA_ByteString *)local_50);
        if (UVar2 == 0) {
          local_68.length = 0;
          local_68.data = (UA_Byte *)0x0;
          offset._7_1_ = '\0';
          UVar2 = UA_Connection_receiveChunksBlocking
                            (connection,&local_68,(UA_Boolean *)((long)&offset + 7),
                             (client->config).timeout);
          if (UVar2 == 0) {
            offset_00 = &message.data;
            message.data = (UA_Byte *)0x0;
            UVar2 = UA_decodeBinary(&local_68,(size_t *)offset_00,&seqHeader,UA_TRANSPORT + 0xb);
            UVar3 = UA_decodeBinary(&local_68,(size_t *)offset_00,&ts_1.tv_nsec,UA_TRANSPORT + 5);
            UVar4 = UA_decodeBinary(&local_68,(size_t *)offset_00,&local_84,UA_TRANSPORT + 7);
            UVar5 = UA_decodeBinary(&local_68,(size_t *)offset_00,
                                    (void *)((long)&expectedRequest.identifier + 8),UA_TYPES + 0x10)
            ;
            local_c0._0_2_ = 0;
            stack0xffffffffffffff44 = 0x1c100000000;
            if ((UVar5 == 0 && (UVar4 == 0 && (UVar3 == 0 && UVar2 == 0))) &&
               (UVar1 = UA_NodeId_equal((UA_NodeId *)((long)&expectedRequest.identifier + 8),
                                        (UA_NodeId *)local_c0), UVar1)) {
              (client->channel).receiveSequenceNumber = local_84;
              UVar2 = UA_decodeBinary(&local_68,(size_t *)&message.data,&opnSecRq.requestedLifetime,
                                      UA_TYPES + 0x54);
              if (offset._7_1_ == '\0') {
                (*(client->connection).releaseRecvBuffer)(connection,&local_68);
              }
              else {
                deleteMembers_noInit(&local_68,UA_TYPES + 0xe);
                local_68.length = 0;
                local_68.data = (UA_Byte *)0x0;
              }
              UVar2 = UVar2 | response.responseHeader.timestamp._4_4_;
              if (UVar2 == 0) {
                clock_gettime(4,(timespec *)&response.serverNonce.data);
                client->nextChannelRenewal =
                     (long)((double)(uint)response.securityToken.createdAt * 10000.0 * 0.75) +
                     ts_1.tv_sec / 100 + (long)response.serverNonce.data * 10000000;
                (client->channel).securityToken.channelId = response.serverProtocolVersion;
                (client->channel).securityToken.tokenId = response._140_4_;
                (client->channel).securityToken.createdAt = response.securityToken._0_8_;
                *(ulong *)&(client->channel).securityToken.revisedLifetime =
                     CONCAT44(response.securityToken.createdAt._4_4_,
                              (uint)response.securityToken.createdAt);
                p = &(client->channel).serverNonce;
                deleteMembers_noInit(p,UA_TYPES + 0xe);
                (client->channel).serverNonce.length = 0;
                (client->channel).serverNonce.data = (UA_Byte *)0x0;
                UA_copy(&response.securityToken.revisedLifetime,p,UA_TYPES + 0xe);
              }
              else {
                lVar8 = 0;
                if ((char)local_54 == '\0') {
                  lVar7 = 0x142ba0;
                  do {
                    if (*(uint *)((long)&statusCodeDescriptions[0].code + lVar8) == UVar2) {
                      lVar7 = (long)&statusCodeDescriptions[0].code + lVar8;
                      break;
                    }
                    lVar8 = lVar8 + 0x18;
                  } while (lVar8 != 0x1578);
                  uVar9 = *(undefined8 *)(lVar7 + 8);
                  msg = "SecureChannel could not be opened with error code %s";
                }
                else {
                  lVar7 = 0x142ba0;
                  do {
                    if (*(uint *)((long)&statusCodeDescriptions[0].code + lVar8) == UVar2) {
                      lVar7 = (long)&statusCodeDescriptions[0].code + lVar8;
                      break;
                    }
                    lVar8 = lVar8 + 0x18;
                  } while (lVar8 != 0x1578);
                  uVar9 = *(undefined8 *)(lVar7 + 8);
                  msg = "SecureChannel could not be renewed with error code %s";
                }
                UA_LOG_INFO((client->config).logger,UA_LOGCATEGORY_SECURECHANNEL,msg,uVar9);
              }
              deleteMembers_noInit(&ts_1.tv_nsec,UA_TRANSPORT + 5);
              ts_1.tv_nsec = 0;
              deleteMembers_noInit(&opnSecRq.requestedLifetime,UA_TYPES + 0x54);
              memset(&opnSecRq.requestedLifetime,0,0xb8);
            }
            else {
              deleteMembers_noInit(&local_68,UA_TYPES + 0xe);
              local_68.length = 0;
              local_68.data = (UA_Byte *)0x0;
              deleteMembers_noInit(&ts_1.tv_nsec,UA_TRANSPORT + 5);
              ts_1.tv_nsec = 0;
              deleteMembers_noInit((void *)((long)&expectedRequest.identifier + 8),UA_TYPES + 0x10);
              UVar2 = 0x80020000;
            }
          }
        }
      }
      else {
        (*(client->connection).releaseSendBuffer)(connection,(UA_ByteString *)local_50);
      }
    }
  }
  return UVar2;
}

Assistant:

static UA_StatusCode
SecureChannelHandshake(UA_Client *client, UA_Boolean renew) {
    /* Check if sc is still valid */
    if(renew && client->nextChannelRenewal - UA_DateTime_nowMonotonic() > 0)
        return UA_STATUSCODE_GOOD;

    UA_Connection *conn = &client->connection;
    if(conn->state != UA_CONNECTION_ESTABLISHED)
        return UA_STATUSCODE_BADSERVERNOTCONNECTED;

    UA_ByteString message;
    UA_StatusCode retval = conn->getSendBuffer(conn, conn->remoteConf.recvBufferSize, &message);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Jump over the messageHeader that will be encoded last */
    size_t offset = 12;

    /* Encode the Asymmetric Security Header */
    UA_AsymmetricAlgorithmSecurityHeader asymHeader;
    UA_AsymmetricAlgorithmSecurityHeader_init(&asymHeader);
    asymHeader.securityPolicyUri = UA_STRING("http://opcfoundation.org/UA/SecurityPolicy#None");
    retval = UA_AsymmetricAlgorithmSecurityHeader_encodeBinary(&asymHeader, &message, &offset);

    /* Encode the sequence header */
    UA_SequenceHeader seqHeader;
    seqHeader.sequenceNumber = ++client->channel.sendSequenceNumber;
    seqHeader.requestId = ++client->requestId;
    retval |= UA_SequenceHeader_encodeBinary(&seqHeader, &message, &offset);

    /* Encode the NodeId of the OpenSecureChannel Service */
    UA_NodeId requestType =
        UA_NODEID_NUMERIC(0, UA_TYPES[UA_TYPES_OPENSECURECHANNELREQUEST].binaryEncodingId);
    retval |= UA_NodeId_encodeBinary(&requestType, &message, &offset);

    /* Encode the OpenSecureChannelRequest */
    UA_OpenSecureChannelRequest opnSecRq;
    UA_OpenSecureChannelRequest_init(&opnSecRq);
    opnSecRq.requestHeader.timestamp = UA_DateTime_now();
    opnSecRq.requestHeader.authenticationToken = client->authenticationToken;
    if(renew) {
        opnSecRq.requestType = UA_SECURITYTOKENREQUESTTYPE_RENEW;
        UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                     "Requesting to renew the SecureChannel");
    } else {
        opnSecRq.requestType = UA_SECURITYTOKENREQUESTTYPE_ISSUE;
        UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                     "Requesting to open a SecureChannel");
    }
    opnSecRq.securityMode = UA_MESSAGESECURITYMODE_NONE;
    opnSecRq.clientNonce = client->channel.clientNonce;
    opnSecRq.requestedLifetime = client->config.secureChannelLifeTime;
    retval |= UA_OpenSecureChannelRequest_encodeBinary(&opnSecRq, &message, &offset);

    /* Encode the message header at the beginning */
    UA_SecureConversationMessageHeader messageHeader;
    messageHeader.messageHeader.messageTypeAndChunkType = UA_MESSAGETYPE_OPN + UA_CHUNKTYPE_FINAL;
    messageHeader.messageHeader.messageSize = (UA_UInt32)offset;
    if(renew)
        messageHeader.secureChannelId = client->channel.securityToken.channelId;
    else
        messageHeader.secureChannelId = 0;
    offset = 0;
    retval |= UA_SecureConversationMessageHeader_encodeBinary(&messageHeader, &message, &offset);

    /* Clean up and return if encoding the message failed */
    if(retval != UA_STATUSCODE_GOOD) {
        client->connection.releaseSendBuffer(&client->connection, &message);
        return retval;
    }

    /* Send the message */
    message.length = messageHeader.messageHeader.messageSize;
    retval = conn->send(conn, &message);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Receive the response */
    UA_ByteString reply = UA_BYTESTRING_NULL;
    UA_Boolean realloced = false;
    retval = UA_Connection_receiveChunksBlocking(conn, &reply, &realloced,
                                                 client->config.timeout);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                     "Receiving OpenSecureChannelResponse failed");
        return retval;
    }

    /* Decode the header */
    offset = 0;
    retval = UA_SecureConversationMessageHeader_decodeBinary(&reply, &offset, &messageHeader);
    retval |= UA_AsymmetricAlgorithmSecurityHeader_decodeBinary(&reply, &offset, &asymHeader);
    retval |= UA_SequenceHeader_decodeBinary(&reply, &offset, &seqHeader);
    retval |= UA_NodeId_decodeBinary(&reply, &offset, &requestType);
    UA_NodeId expectedRequest =
        UA_NODEID_NUMERIC(0, UA_TYPES[UA_TYPES_OPENSECURECHANNELRESPONSE].binaryEncodingId);
    if(retval != UA_STATUSCODE_GOOD || !UA_NodeId_equal(&requestType, &expectedRequest)) {
        UA_ByteString_deleteMembers(&reply);
        UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&asymHeader);
        UA_NodeId_deleteMembers(&requestType);
        UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_CLIENT,
                     "Reply answers the wrong request. Expected OpenSecureChannelResponse.");
        return UA_STATUSCODE_BADINTERNALERROR;
    }

    /* Save the sequence number from server */
    client->channel.receiveSequenceNumber = seqHeader.sequenceNumber;

    /* Decode the response */
    UA_OpenSecureChannelResponse response;
    retval = UA_OpenSecureChannelResponse_decodeBinary(&reply, &offset, &response);

    /* Free the message */
    if(!realloced)
        conn->releaseRecvBuffer(conn, &reply);
    else
        UA_ByteString_deleteMembers(&reply);

    /* Results in either the StatusCode of decoding or the service */
    retval |= response.responseHeader.serviceResult;

    if(retval == UA_STATUSCODE_GOOD) {
        /* Response.securityToken.revisedLifetime is UInt32 we need to cast it
         * to DateTime=Int64 we take 75% of lifetime to start renewing as
         *  described in standard */
        client->nextChannelRenewal = UA_DateTime_nowMonotonic() +
            (UA_DateTime)(response.securityToken.revisedLifetime * (UA_Double)UA_MSEC_TO_DATETIME * 0.75);

        /* Replace the old nonce */
        UA_ChannelSecurityToken_deleteMembers(&client->channel.securityToken);
        UA_ChannelSecurityToken_copy(&response.securityToken, &client->channel.securityToken);
        UA_ByteString_deleteMembers(&client->channel.serverNonce);
        UA_ByteString_copy(&response.serverNonce, &client->channel.serverNonce);

        if(renew)
            UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                         "SecureChannel renewed");
        else
            UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                         "SecureChannel opened");
    } else {
        if(renew)
            UA_LOG_INFO(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                        "SecureChannel could not be renewed "
                        "with error code %s", UA_StatusCode_name(retval));
        else
            UA_LOG_INFO(client->config.logger, UA_LOGCATEGORY_SECURECHANNEL,
                        "SecureChannel could not be opened "
                        "with error code %s", UA_StatusCode_name(retval));
    }

    /* Clean up */
    UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&asymHeader);
    UA_OpenSecureChannelResponse_deleteMembers(&response);
    return retval;
}